

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O3

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_t __n;
  long lVar5;
  
  iVar1 = *(int *)(*(long *)(ctx + 0x100) + 8);
  __n = (size_t)iVar1;
  if ((int)((long)((ulong)(uint)((int)in >> 0x1f) << 0x20 | (ulong)in & 0xffffffff) % (long)iVar1)
      != 0) {
    __assert_fail("(len % blocksize) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/thirdparty/libssh2/src/transport.c"
                  ,0x8b,"int decrypt(LIBSSH2_SESSION *, unsigned char *, unsigned char *, int)");
  }
  uVar4 = (ulong)in & 0xffffffff;
  if (iVar1 <= (int)in) {
    lVar5 = 0;
    do {
      iVar2 = (**(code **)(*(long *)(ctx + 0x100) + 0x28))(ctx,out + lVar5,__n,ctx + 0x108);
      if (iVar2 != 0) {
        (**(code **)(ctx + 0x18))(*(undefined8 *)(ctx + 0x4250),ctx);
        return -0xc;
      }
      memcpy((void *)((long)outlen + lVar5),out + lVar5,__n);
      uVar3 = (int)uVar4 - iVar1;
      uVar4 = (ulong)uVar3;
      lVar5 = lVar5 + __n;
    } while (iVar1 <= (int)uVar3);
  }
  return 0;
}

Assistant:

static int
decrypt(LIBSSH2_SESSION * session, unsigned char *source,
        unsigned char *dest, int len)
{
    struct transportpacket *p = &session->packet;
    int blocksize = session->remote.crypt->blocksize;

    /* if we get called with a len that isn't an even number of blocksizes
       we risk losing those extra bytes */
    assert((len % blocksize) == 0);

    while (len >= blocksize) {
        if (session->remote.crypt->crypt(session, source, blocksize,
                                         &session->remote.crypt_abstract)) {
            LIBSSH2_FREE(session, p->payload);
            return LIBSSH2_ERROR_DECRYPT;
        }

        /* if the crypt() function would write to a given address it
           wouldn't have to memcpy() and we could avoid this memcpy()
           too */
        memcpy(dest, source, blocksize);

        len -= blocksize;       /* less bytes left */
        dest += blocksize;      /* advance write pointer */
        source += blocksize;    /* advance read pointer */
    }
    return LIBSSH2_ERROR_NONE;         /* all is fine */
}